

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_refs.cpp
# Opt level: O1

EncFrmStatus * get_ref_from_cpb(EncVirtualCpb *cpb,EncFrmStatus *frm)

{
  ulong uVar1;
  uint uVar2;
  EncFrmStatus *pEVar3;
  uint uVar4;
  char *pcVar5;
  long lVar6;
  bool bVar7;
  
  uVar1 = frm->val;
  if ((uVar1 & 0x20) == 0) {
    uVar4 = (uint)(uVar1 >> 0x10) & 0x3f;
    lVar6 = (long)(char)(uVar1 >> 0x16);
    if (uVar4 < 7) {
      switch((ulong)uVar4) {
      default:
        pEVar3 = cpb->mode_refs + uVar4;
        break;
      case 4:
        pEVar3 = cpb->st_tid_refs + lVar6;
        break;
      case 5:
        pEVar3 = cpb->lt_idx_refs + lVar6;
        break;
      case 6:
        pEVar3 = cpb->cpb_refs + lVar6;
      }
    }
    else {
      pEVar3 = (EncFrmStatus *)0x0;
      _mpp_log_l(2,"mpp_enc_refs","frm %d not supported ref mode 0x%x\n","get_ref_from_cpb",
                 uVar1 >> 0x30,(ulong)uVar4);
    }
    if (pEVar3 != (EncFrmStatus *)0x0) {
      uVar1 = pEVar3->val;
      if ((uVar1 & 1) == 0) {
        _mpp_log_l(2,"mpp_enc_refs","frm %d found mode %d arg %d -> ref %d but it is invalid\n",
                   "get_ref_from_cpb",(ulong)*(ushort *)((long)frm + 6),(ulong)uVar4,lVar6,
                   uVar1 >> 0x30);
        return pEVar3;
      }
      if (((byte)enc_refs_debug & 2) == 0) {
        return pEVar3;
      }
      bVar7 = -1 < (char)uVar1;
      pcVar5 = "lt";
      if (bVar7) {
        pcVar5 = "st";
      }
      uVar2 = (uint)(uVar1 >> 8) & 0xf;
      if (bVar7) {
        uVar2 = 0;
      }
      _mpp_log_l(4,"mpp_enc_refs","frm %d ref mode %d arg %d -> seq %d %s idx %d\n",
                 "get_ref_from_cpb",(ulong)*(ushort *)((long)frm + 6),(ulong)uVar4,lVar6,
                 uVar1 >> 0x30,pcVar5,(ulong)uVar2);
      return pEVar3;
    }
  }
  return (EncFrmStatus *)0x0;
}

Assistant:

static EncFrmStatus *get_ref_from_cpb(EncVirtualCpb *cpb, EncFrmStatus *frm)
{
    MppEncRefMode ref_mode = frm->ref_mode;
    RK_S32 ref_arg = frm->ref_arg;

    if (frm->is_idr)
        return NULL;

    EncFrmStatus *ref = NULL;

    /* step 3.1 find seq_idx by mode and arg */
    switch (ref_mode) {
    case REF_TO_PREV_REF_FRM :
    case REF_TO_PREV_ST_REF :
    case REF_TO_PREV_LT_REF :
    case REF_TO_PREV_INTRA : {
        ref = &cpb->mode_refs[ref_mode];
    } break;
    case REF_TO_TEMPORAL_LAYER : {
        ref = &cpb->st_tid_refs[ref_arg];
    } break;
    case REF_TO_LT_REF_IDX : {
        ref = &cpb->lt_idx_refs[ref_arg];
    } break;
    case REF_TO_ST_PREV_N_REF : {
        ref = &cpb->cpb_refs[ref_arg];
    } break;
    case REF_TO_ST_REF_SETUP :
    default : {
        mpp_err_f("frm %d not supported ref mode 0x%x\n", frm->seq_idx, ref_mode);
    } break;
    }

    if (ref) {
        if (ref->valid)
            enc_refs_dbg_flow("frm %d ref mode %d arg %d -> seq %d %s idx %d\n",
                              frm->seq_idx, ref_mode, ref_arg, ref->seq_idx,
                              ref->is_lt_ref ? "lt" : "st",
                              ref->is_lt_ref ? ref->lt_idx : 0);
        else
            mpp_err_f("frm %d found mode %d arg %d -> ref %d but it is invalid\n",
                      frm->seq_idx, ref_mode, ref_arg, ref->seq_idx);
    } else {
        ref = NULL;
    }

    return ref;
}